

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.c
# Opt level: O2

void cubic_coef(spx_word16_t frac,spx_word16_t *interp)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar2 = frac * 0.16667 * frac * frac;
  fVar3 = frac * 0.5 * frac;
  fVar1 = (frac * -0.33333 + fVar3) - fVar2;
  fVar2 = fVar2 + frac * -0.16667;
  fVar3 = fVar3 + frac + -fVar3 * frac;
  *(ulong *)interp = CONCAT44(fVar3,fVar2);
  interp[3] = fVar1;
  interp[2] = ((1.0 - fVar2) - fVar3) - fVar1;
  return;
}

Assistant:

static void cubic_coef(spx_word16_t frac, spx_word16_t interp[4])
{
   /* Compute interpolation coefficients. I'm not sure whether this corresponds to cubic interpolation
   but I know it's MMSE-optimal on a sinc */
   interp[0] =  -0.16667f*frac + 0.16667f*frac*frac*frac;
   interp[1] = frac + 0.5f*frac*frac - 0.5f*frac*frac*frac;
   /*interp[2] = 1.f - 0.5f*frac - frac*frac + 0.5f*frac*frac*frac;*/
   interp[3] = -0.33333f*frac + 0.5f*frac*frac - 0.16667f*frac*frac*frac;
   /* Just to make sure we don't have rounding problems */
   interp[2] = 1.-interp[0]-interp[1]-interp[3];
}